

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlFAEliminateEpsilonTransitions(xmlRegParserCtxtPtr ctxt)

{
  xmlRegStateType xVar1;
  int iVar2;
  int iVar3;
  xmlRegTrans *pxVar4;
  xmlRegStatePtr pxVar5;
  xmlRegStatePtr *ppxVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  xmlRegStatePtr pxVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (ctxt->states != (xmlRegStatePtr *)0x0) {
    if (0 < ctxt->nbStates) {
      uVar15 = 0;
      do {
        pxVar13 = ctxt->states[uVar15];
        if ((((((pxVar13 != (xmlRegStatePtr)0x0) && (pxVar13->nbTrans == 1)) &&
              (xVar1 = pxVar13->type, xVar1 != XML_REGEXP_FINAL_STATE)) &&
             ((xVar1 != XML_REGEXP_UNREACH_STATE &&
              (pxVar4 = pxVar13->trans, pxVar4->atom == (xmlRegAtomPtr)0x0)))) &&
            ((uVar14 = (ulong)(uint)pxVar4->to, uVar15 != uVar14 && -1 < pxVar4->to &&
             ((pxVar4->counter < 0 && (xVar1 != XML_REGEXP_START_STATE)))))) && (pxVar4->count < 0))
        {
          if (0 < pxVar13->nbTransTo) {
            lVar10 = 0;
            do {
              pxVar5 = ctxt->states[pxVar13->transTo[lVar10]];
              if (0 < pxVar5->nbTrans) {
                lVar12 = 0x10;
                lVar11 = 0;
                do {
                  pxVar4 = pxVar5->trans;
                  if (uVar15 == *(uint *)((long)pxVar4 + lVar12 + -8)) {
                    *(undefined4 *)((long)pxVar4 + lVar12 + -8) = 0xffffffff;
                    xmlRegStateAddTrans(ctxt,pxVar5,
                                        *(xmlRegAtomPtr *)((long)pxVar4 + lVar12 + -0x10),
                                        ctxt->states[uVar14],*(int *)((long)pxVar4 + lVar12 + -4),
                                        *(int *)((long)&pxVar4->atom + lVar12));
                  }
                  lVar11 = lVar11 + 1;
                  lVar12 = lVar12 + 0x18;
                } while (lVar11 < pxVar5->nbTrans);
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < pxVar13->nbTransTo);
          }
          if (pxVar13->type == XML_REGEXP_FINAL_STATE) {
            ctxt->states[uVar14]->type = XML_REGEXP_FINAL_STATE;
          }
          pxVar13->nbTrans = 0;
          pxVar13->type = XML_REGEXP_UNREACH_STATE;
        }
        uVar15 = uVar15 + 1;
      } while ((long)uVar15 < (long)ctxt->nbStates);
    }
    uVar9 = ctxt->nbStates;
    if (0 < (int)uVar9) {
      lVar10 = 0;
      do {
        pxVar13 = ctxt->states[lVar10];
        if ((pxVar13 != (xmlRegStatePtr)0x0) && (pxVar13->type == XML_REGEXP_UNREACH_STATE)) {
          if (pxVar13->trans != (xmlRegTrans *)0x0) {
            (*xmlFree)(pxVar13->trans);
          }
          if (pxVar13->transTo != (int *)0x0) {
            (*xmlFree)(pxVar13->transTo);
          }
          (*xmlFree)(pxVar13);
          ctxt->states[lVar10] = (xmlRegStatePtr)0x0;
        }
        lVar10 = lVar10 + 1;
        uVar9 = ctxt->nbStates;
      } while (lVar10 < (int)uVar9);
    }
    if (0 < (int)uVar9) {
      bVar8 = false;
      uVar15 = (ulong)uVar9;
      do {
        uVar14 = uVar15 - 1;
        pxVar13 = ctxt->states[uVar15 - 1];
        if (pxVar13 != (xmlRegStatePtr)0x0) {
          if ((pxVar13->nbTrans == 0) && (pxVar13->type != XML_REGEXP_FINAL_STATE)) {
            pxVar13->type = XML_REGEXP_SINK_STATE;
          }
          if (0 < pxVar13->nbTrans) {
            lVar11 = 0x10;
            lVar10 = 0;
            do {
              pxVar4 = pxVar13->trans;
              if (*(long *)((long)pxVar4 + lVar11 + -0x10) == 0) {
                iVar2 = *(int *)((long)pxVar4 + lVar11 + -8);
                if (-1 < (long)iVar2) {
                  if (uVar14 == (long)iVar2) {
                    *(undefined4 *)((long)pxVar4 + lVar11 + -8) = 0xffffffff;
                  }
                  else if (*(int *)((long)&pxVar4->atom + lVar11) < 0) {
                    *(undefined4 *)((long)pxVar4 + lVar11 + -8) = 0xfffffffe;
                    pxVar13->mark = XML_REGEXP_MARK_START;
                    xmlFAReduceEpsilonTransitions
                              (ctxt,(int)uVar14,iVar2,*(int *)((long)pxVar4 + lVar11 + -4));
                    xmlFAFinishReduceEpsilonTransitions(ctxt,iVar2);
                    pxVar13->mark = XML_REGEXP_MARK_NORMAL;
                    bVar8 = true;
                  }
                }
              }
              lVar10 = lVar10 + 1;
              lVar11 = lVar11 + 0x18;
            } while (lVar10 < pxVar13->nbTrans);
          }
        }
        bVar7 = 1 < (long)uVar15;
        uVar15 = uVar14;
      } while (bVar7);
      if ((bVar8) && (iVar2 = ctxt->nbStates, 0 < (long)iVar2)) {
        ppxVar6 = ctxt->states;
        lVar10 = 0;
        do {
          pxVar13 = ppxVar6[lVar10];
          if ((pxVar13 != (xmlRegStatePtr)0x0) && (iVar3 = pxVar13->nbTrans, 0 < (long)iVar3)) {
            pxVar4 = pxVar13->trans;
            lVar11 = 0;
            do {
              if (((*(long *)((long)&pxVar4->atom + lVar11) == 0) &&
                  (*(int *)((long)&pxVar4->count + lVar11) < 0)) &&
                 (-1 < *(int *)((long)&pxVar4->to + lVar11))) {
                *(undefined4 *)((long)&pxVar4->to + lVar11) = 0xffffffff;
              }
              lVar11 = lVar11 + 0x18;
            } while ((long)iVar3 * 0x18 != lVar11);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != iVar2);
      }
    }
    uVar9 = ctxt->nbStates;
    if (0 < (long)(int)uVar9) {
      ppxVar6 = ctxt->states;
      lVar10 = 0;
      do {
        if (ppxVar6[lVar10] != (xmlRegStatePtr)0x0) {
          ppxVar6[lVar10]->reached = XML_REGEXP_MARK_NORMAL;
        }
        lVar10 = lVar10 + 1;
      } while ((int)uVar9 != lVar10);
    }
    ppxVar6 = ctxt->states;
    pxVar13 = *ppxVar6;
    if (pxVar13 != (xmlRegStatePtr)0x0) {
      pxVar13->reached = XML_REGEXP_MARK_START;
      do {
        pxVar13->reached = XML_REGEXP_MARK_VISITED;
        iVar2 = pxVar13->nbTrans;
        if ((long)iVar2 < 1) {
          pxVar13 = (xmlRegStatePtr)0x0;
        }
        else {
          pxVar4 = pxVar13->trans;
          lVar10 = 0;
          pxVar13 = (xmlRegStatePtr)0x0;
          do {
            if (((-1 < *(int *)((long)&pxVar4->to + lVar10)) &&
                ((*(long *)((long)&pxVar4->atom + lVar10) != 0 ||
                 (-1 < *(int *)((long)&pxVar4->count + lVar10))))) &&
               ((pxVar5 = ppxVar6[*(int *)((long)&pxVar4->to + lVar10)],
                pxVar5 != (xmlRegStatePtr)0x0 && (pxVar5->reached == XML_REGEXP_MARK_NORMAL)))) {
              pxVar5->reached = XML_REGEXP_MARK_START;
              pxVar13 = pxVar5;
            }
            lVar10 = lVar10 + 0x18;
          } while ((long)iVar2 * 0x18 != lVar10);
        }
        if (pxVar13 == (xmlRegStatePtr)0x0 && 1 < (int)uVar9) {
          uVar15 = 1;
          do {
            pxVar13 = ppxVar6[uVar15];
            if ((pxVar13 != (xmlRegStatePtr)0x0) && (pxVar13->reached == XML_REGEXP_MARK_START))
            goto LAB_0017cb3b;
            uVar15 = uVar15 + 1;
          } while (uVar9 != uVar15);
          pxVar13 = (xmlRegStatePtr)0x0;
        }
LAB_0017cb3b:
      } while (pxVar13 != (xmlRegStatePtr)0x0);
    }
    if (0 < ctxt->nbStates) {
      lVar10 = 0;
      do {
        pxVar13 = ctxt->states[lVar10];
        if ((pxVar13 != (xmlRegStatePtr)0x0) && (pxVar13->reached == XML_REGEXP_MARK_NORMAL)) {
          if (pxVar13->trans != (xmlRegTrans *)0x0) {
            (*xmlFree)(pxVar13->trans);
          }
          if (pxVar13->transTo != (int *)0x0) {
            (*xmlFree)(pxVar13->transTo);
          }
          (*xmlFree)(pxVar13);
          ctxt->states[lVar10] = (xmlRegStatePtr)0x0;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < ctxt->nbStates);
    }
  }
  return;
}

Assistant:

static void
xmlFAEliminateEpsilonTransitions(xmlRegParserCtxtPtr ctxt) {
    int statenr, transnr;
    xmlRegStatePtr state;
    int has_epsilon;

    if (ctxt->states == NULL) return;

    /*
     * Eliminate simple epsilon transition and the associated unreachable
     * states.
     */
    xmlFAEliminateSimpleEpsilonTransitions(ctxt);
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if ((state != NULL) && (state->type == XML_REGEXP_UNREACH_STATE)) {
	    xmlRegFreeState(state);
	    ctxt->states[statenr] = NULL;
	}
    }

    has_epsilon = 0;

    /*
     * Build the completed transitions bypassing the epsilons
     * Use a marking algorithm to avoid loops
     * Mark sink states too.
     * Process from the latest states backward to the start when
     * there is long cascading epsilon chains this minimize the
     * recursions and transition compares when adding the new ones
     */
    for (statenr = ctxt->nbStates - 1;statenr >= 0;statenr--) {
	state = ctxt->states[statenr];
	if (state == NULL)
	    continue;
	if ((state->nbTrans == 0) &&
	    (state->type != XML_REGEXP_FINAL_STATE)) {
	    state->type = XML_REGEXP_SINK_STATE;
	}
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    if ((state->trans[transnr].atom == NULL) &&
		(state->trans[transnr].to >= 0)) {
		if (state->trans[transnr].to == statenr) {
		    state->trans[transnr].to = -1;
		} else if (state->trans[transnr].count < 0) {
		    int newto = state->trans[transnr].to;

		    has_epsilon = 1;
		    state->trans[transnr].to = -2;
		    state->mark = XML_REGEXP_MARK_START;
		    xmlFAReduceEpsilonTransitions(ctxt, statenr,
				      newto, state->trans[transnr].counter);
		    xmlFAFinishReduceEpsilonTransitions(ctxt, newto);
		    state->mark = XML_REGEXP_MARK_NORMAL;
	        }
	    }
	}
    }
    /*
     * Eliminate the epsilon transitions
     */
    if (has_epsilon) {
	for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	    state = ctxt->states[statenr];
	    if (state == NULL)
		continue;
	    for (transnr = 0;transnr < state->nbTrans;transnr++) {
		xmlRegTransPtr trans = &(state->trans[transnr]);
		if ((trans->atom == NULL) &&
		    (trans->count < 0) &&
		    (trans->to >= 0)) {
		    trans->to = -1;
		}
	    }
	}
    }

    /*
     * Use this pass to detect unreachable states too
     */
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if (state != NULL)
	    state->reached = XML_REGEXP_MARK_NORMAL;
    }
    state = ctxt->states[0];
    if (state != NULL)
	state->reached = XML_REGEXP_MARK_START;
    while (state != NULL) {
	xmlRegStatePtr target = NULL;
	state->reached = XML_REGEXP_MARK_VISITED;
	/*
	 * Mark all states reachable from the current reachable state
	 */
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    if ((state->trans[transnr].to >= 0) &&
		((state->trans[transnr].atom != NULL) ||
		 (state->trans[transnr].count >= 0))) {
		int newto = state->trans[transnr].to;

		if (ctxt->states[newto] == NULL)
		    continue;
		if (ctxt->states[newto]->reached == XML_REGEXP_MARK_NORMAL) {
		    ctxt->states[newto]->reached = XML_REGEXP_MARK_START;
		    target = ctxt->states[newto];
		}
	    }
	}

	/*
	 * find the next accessible state not explored
	 */
	if (target == NULL) {
	    for (statenr = 1;statenr < ctxt->nbStates;statenr++) {
		state = ctxt->states[statenr];
		if ((state != NULL) && (state->reached ==
			XML_REGEXP_MARK_START)) {
		    target = state;
		    break;
		}
	    }
	}
	state = target;
    }
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if ((state != NULL) && (state->reached == XML_REGEXP_MARK_NORMAL)) {
	    xmlRegFreeState(state);
	    ctxt->states[statenr] = NULL;
	}
    }

}